

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar1;
  AlphaNum local_78;
  string_view local_48 [3];
  
  local_48[0] = NullSafeStringView(
                                  "Illegal jstype for int64, uint64, sint64, fixed64 or sfixed64 field: "
                                  );
  this_00 = google::protobuf::FieldOptions_JSType_descriptor();
  pEVar1 = google::protobuf::EnumDescriptor::value(this_00,**(int **)this);
  local_78.piece_._M_str = (pEVar1->all_names_->_M_dataplus)._M_p;
  local_78.piece_._M_len = pEVar1->all_names_->_M_string_length;
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,
                    (AlphaNum *)local_78.piece_._M_str);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}